

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Session::Session(Session *this)

{
  ostream *poVar1;
  logic_error *this_00;
  string msg;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Session_001756b0;
  makeCommandLineParser();
  (this->m_unusedTokens).
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_configData).listTests = false;
  (this->m_configData).listTags = false;
  (this->m_configData).listReporters = false;
  (this->m_configData).listTestNamesOnly = false;
  (this->m_configData).showSuccessfulTests = false;
  (this->m_configData).shouldDebugBreak = false;
  (this->m_configData).noThrow = false;
  (this->m_configData).showHelp = false;
  (this->m_unusedTokens).
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_unusedTokens).
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_configData).showInvisibles = false;
  (this->m_configData).filenamesAsTags = false;
  (this->m_configData).abortAfter = -1;
  (this->m_configData).rngSeed = 0;
  (this->m_configData).verbosity = Normal;
  (this->m_configData).warnings = Nothing;
  (this->m_configData).showDurations = DefaultForReporter;
  (this->m_configData).runOrder = InDeclarationOrder;
  (this->m_configData).useColour = Auto;
  (this->m_configData).outputFilename._M_dataplus._M_p =
       (pointer)&(this->m_configData).outputFilename.field_2;
  (this->m_configData).outputFilename._M_string_length = 0;
  (this->m_configData).outputFilename.field_2._M_local_buf[0] = '\0';
  (this->m_configData).name._M_dataplus._M_p = (pointer)&(this->m_configData).name.field_2;
  (this->m_configData).name._M_string_length = 0;
  (this->m_configData).name.field_2._M_local_buf[0] = '\0';
  (this->m_configData).processName._M_dataplus._M_p =
       (pointer)&(this->m_configData).processName.field_2;
  (this->m_configData).processName._M_string_length = 0;
  (this->m_configData).processName.field_2._M_local_buf[0] = '\0';
  (this->m_configData).reporterNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_configData).reporterNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_configData).reporterNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_configData).testsOrTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_configData).testsOrTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_configData).testsOrTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_config).m_p = (Config *)0x0;
  if (alreadyInstantiated != '\x01') {
    alreadyInstantiated = 1;
    return;
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Only one instance of Catch::Session can ever be used","");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_48,local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Session()
        : m_cli( makeCommandLineParser() ) {
            if( alreadyInstantiated ) {
                std::string msg = "Only one instance of Catch::Session can ever be used";
                Catch::cerr() << msg << std::endl;
                throw std::logic_error( msg );
            }
            alreadyInstantiated = true;
        }